

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

iter_result * __thiscall
unodb::detail::
basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::begin(iter_result *__return_storage_ptr__,
       basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
       *this)

{
  undefined1 uVar1;
  uintptr_t uVar2;
  uint64_t i;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 0x100) {
      cannot_happen("/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                    ,0x946,"begin");
    }
    if ((this->child_indexes)._M_elems[lVar3].value != 0xff) break;
    lVar3 = lVar3 + 1;
  }
  uVar2 = basic_node_ptr<unodb::detail::node_header>::tag_ptr((node_header *)this,I48);
  (__return_storage_ptr__->node).tagged_ptr = uVar2;
  __return_storage_ptr__->key_byte = (byte)lVar3;
  __return_storage_ptr__->child_index = (byte)lVar3;
  uVar1 = this->field_0x7;
  *(key_prefix_data *)&__return_storage_ptr__->prefix =
       (key_prefix_data)*(undefined7 *)&this->field_0x0;
  *(undefined1 *)((long)&__return_storage_ptr__->prefix + 7) = uVar1;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr typename basic_inode_48::iter_result
  begin() noexcept {
    for (std::uint64_t i = 0; i < 256; i++) {
      if (child_indexes[i] != empty_child) {
        const auto key = static_cast<std::byte>(i);
        const auto child_index = static_cast<std::uint8_t>(i);
        return {node_ptr{this, node_type::I48}, key, child_index,
                this->get_key_prefix().get_snapshot()};
      }
    }
    // because we always have at least 17 keys.
    UNODB_DETAIL_CANNOT_HAPPEN();  // LCOV_EXCL_LINE
  }